

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O2

String * __thiscall
Rml::PropertySpecification::PropertiesToString_abi_cxx11_
          (String *__return_storage_ptr__,PropertySpecification *this,PropertyDictionary *dictionary
          ,bool include_name,char delimiter)

{
  NodePtr pDVar1;
  PropertyIdNameMap *pPVar2;
  long lVar3;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *pTVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  uint8_t *extraout_RDX;
  pointer pPVar6;
  const_iterator cVar7;
  PropertyId id;
  PropertyMap *__range1;
  Vector<PropertyId> ids;
  const_iterator __begin1;
  PropertyId local_a9;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *local_a8;
  undefined4 local_9c;
  _Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> local_98;
  PropertySpecification *local_80;
  pointer local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  String local_50;
  
  local_9c = (undefined4)CONCAT71(in_register_00000009,include_name);
  local_80 = this;
  local_a8 = PropertyDictionary::GetProperties(dictionary);
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::reserve
            ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)&local_98,
             local_a8->mNumElements);
  pTVar4 = local_a8;
  cVar7 = robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::cbegin(local_a8);
  pDVar1 = (NodePtr)pTVar4->mInfo;
  local_70._0_16_ = cVar7;
  while( true ) {
    if (cVar7.mKeyVals == pDVar1) break;
    ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::push_back
              ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)&local_98,
               (value_type *)cVar7.mKeyVals);
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++((Iter<true> *)&local_70);
    cVar7.mInfo = extraout_RDX;
    cVar7.mKeyVals = (NodePtr)local_70._M_dataplus._M_p;
  }
  ::std::
  __sort<__gnu_cxx::__normal_iterator<Rml::PropertyId*,std::vector<Rml::PropertyId,std::allocator<Rml::PropertyId>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_98._M_impl.super__Vector_impl_data._M_start,
             local_98._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = local_98._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar6 = local_98._M_impl.super__Vector_impl_data._M_start; pPVar6 != local_78;
      pPVar6 = pPVar6 + 1) {
    local_a9 = *pPVar6;
    cVar7 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::find(local_a8,&local_a9);
    if ((char)local_9c != '\0') {
      pPVar2 = (local_80->property_map)._M_t.
               super___uniq_ptr_impl<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::PropertyIdNameMap_*,_std::default_delete<Rml::PropertyIdNameMap>_>
               .super__Head_base<0UL,_Rml::PropertyIdNameMap_*,_false>._M_head_impl;
      uVar5 = (uint)local_a9;
      lVar3 = *(long *)&(pPVar2->super_IdNameMap<Rml::PropertyId>).name_map;
      if ((ulong)((long)*(pointer *)((long)&(pPVar2->super_IdNameMap<Rml::PropertyId>).name_map + 8)
                  - lVar3 >> 5) <= (ulong)local_a9) {
        uVar5 = 0;
      }
      ::std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar3 + (ulong)(uVar5 << 5)),": ");
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
    Property::ToString_abi_cxx11_(&local_50,&((cVar7.mKeyVals)->mData).second);
    ::std::operator+(&local_70,&local_50,delimiter);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    ::std::__cxx11::string::pop_back();
  }
  ::std::_Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::~_Vector_base(&local_98);
  return __return_storage_ptr__;
}

Assistant:

String PropertySpecification::PropertiesToString(const PropertyDictionary& dictionary, bool include_name, char delimiter) const
{
	const PropertyMap& properties = dictionary.GetProperties();

	// For determinism we print the strings in order of increasing property ids.
	Vector<PropertyId> ids;
	ids.reserve(properties.size());
	for (auto& pair : properties)
		ids.push_back(pair.first);

	std::sort(ids.begin(), ids.end());

	String result;
	for (PropertyId id : ids)
	{
		const Property& p = properties.find(id)->second;
		if (include_name)
			result += property_map->GetName(id) + ": ";
		result += p.ToString() + delimiter;
	}

	if (!result.empty())
		result.pop_back();

	return result;
}